

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-matrix.c
# Opt level: O2

_Bool plutovg_matrix_invert(plutovg_matrix_t *matrix,plutovg_matrix_t *inverse)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float fVar7;
  float fVar8;
  
  fVar1 = matrix->a;
  fVar2 = matrix->d;
  uVar3 = matrix->b;
  uVar5 = matrix->c;
  fVar7 = fVar1 * fVar2 - (float)uVar5 * (float)uVar3;
  if ((inverse != (plutovg_matrix_t *)0x0) && ((fVar7 != 0.0 || (NAN(fVar7))))) {
    fVar8 = 1.0 / fVar7;
    uVar4 = matrix->e;
    uVar6 = matrix->f;
    inverse->a = fVar2 * fVar8;
    inverse->b = -(float)uVar3 * fVar8;
    inverse->c = -(float)uVar5 * fVar8;
    inverse->d = fVar1 * fVar8;
    inverse->e = ((float)uVar5 * (float)uVar6 + -fVar2 * (float)uVar4) * fVar8;
    inverse->f = ((float)uVar3 * (float)uVar4 + -fVar1 * (float)uVar6) * fVar8;
  }
  return (_Bool)(-(fVar7 != 0.0) & 1);
}

Assistant:

bool plutovg_matrix_invert(const plutovg_matrix_t* matrix, plutovg_matrix_t* inverse)
{
    float det = (matrix->a * matrix->d - matrix->b * matrix->c);
    if(det == 0.f)
        return false;
    if(inverse) {
        float inv_det = 1.f / det;
        float a = matrix->a * inv_det;
        float b = matrix->b * inv_det;
        float c = matrix->c * inv_det;
        float d = matrix->d * inv_det;
        float e = (matrix->c * matrix->f - matrix->d * matrix->e) * inv_det;
        float f = (matrix->b * matrix->e - matrix->a * matrix->f) * inv_det;
        plutovg_matrix_init(inverse, d, -b, -c, a, e, f);
    }

    return true;
}